

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> *
BytesToBits(vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  long lVar1;
  size_type sVar2;
  byte *pbVar3;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  long in_FS_OFFSET;
  uint p;
  vector<bool,_std::allocator<bool>_> *ret;
  allocator<bool> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
  std::allocator<bool>::allocator(in_stack_ffffffffffffff68);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             (size_type)in_stack_ffffffffffffff68,(allocator_type *)0xdf6b31);
  std::allocator<bool>::~allocator(in_stack_ffffffffffffff68);
  for (local_48 = 0;
      sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
      local_48 < sVar2; local_48 = local_48 + 1) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                        CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff7f = (*pbVar3 >> (local_48 & 7) & 1) != 0;
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::_Bit_reference::operator=
              ((_Bit_reference *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               (bool)in_stack_ffffffffffffff77);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<bool> BytesToBits(const std::vector<unsigned char>& bytes)
{
    std::vector<bool> ret(bytes.size() * 8);
    for (unsigned int p = 0; p < ret.size(); p++) {
        ret[p] = (bytes[p / 8] & (1 << (p % 8))) != 0;
    }
    return ret;
}